

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PutVarint(uchar *p,u64 v)

{
  u64 v_local;
  uchar *p_local;
  
  if (v < 0x80) {
    *p = (byte)v & 0x7f;
    p_local._4_4_ = 1;
  }
  else if (v < 0x4000) {
    *p = (byte)(v >> 7) & 0x7f | 0x80;
    p[1] = (byte)v & 0x7f;
    p_local._4_4_ = 2;
  }
  else {
    p_local._4_4_ = putVarint64(p,v);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PutVarint(unsigned char *p, u64 v){
  if( v<=0x7f ){
    p[0] = v&0x7f;
    return 1;
  }
  if( v<=0x3fff ){
    p[0] = ((v>>7)&0x7f)|0x80;
    p[1] = v&0x7f;
    return 2;
  }
  return putVarint64(p,v);
}